

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void glcts::prepareGradXForFace
               (GLfloat *grad_x,GLuint face,GLfloat *texture_coordinates,GLuint width)

{
  GLuint i;
  long lVar1;
  long lVar2;
  GLfloat *pGVar3;
  GLfloat *pGVar4;
  ulong uVar5;
  
  uVar5 = 0xfffffffffffffffe;
  pGVar3 = grad_x;
  pGVar4 = texture_coordinates;
  do {
    getRightNeighbour(pGVar4,face,1,width,pGVar3);
    uVar5 = uVar5 + 2;
    pGVar4 = pGVar4 + 8;
    pGVar3 = pGVar3 + 8;
  } while (uVar5 < 7);
  pGVar3 = texture_coordinates + 4;
  pGVar4 = grad_x + 4;
  uVar5 = 0xffffffffffffffff;
  do {
    getRightNeighbour(pGVar3,face,width * 4,width,pGVar4);
    uVar5 = uVar5 + 2;
    pGVar3 = pGVar3 + 8;
    pGVar4 = pGVar4 + 8;
  } while (uVar5 < 7);
  lVar1 = 0;
  do {
    lVar2 = 0;
    do {
      grad_x[lVar2] = grad_x[lVar2] - texture_coordinates[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar1 = lVar1 + 1;
    grad_x = grad_x + 4;
    texture_coordinates = texture_coordinates + 4;
  } while (lVar1 != 9);
  return;
}

Assistant:

void prepareGradXForFace(glw::GLfloat* grad_x, glw::GLuint face, glw::GLfloat* texture_coordinates, glw::GLuint width)
{
	static const glw::GLuint n_points_per_face				  = 9;
	static const glw::GLuint n_texture_coordinates_components = 4;
	static const glw::GLuint n_grad_components				  = 4;

	for (glw::GLuint i = 0; i < n_points_per_face; i += 2)
	{
		const glw::GLuint texture_coordinates_offset = i * n_texture_coordinates_components;
		const glw::GLuint grad_offset				 = i * n_grad_components;

		getRightNeighbour(texture_coordinates + texture_coordinates_offset, face, 1, width, grad_x + grad_offset);
	}

	for (glw::GLuint i = 1; i < n_points_per_face; i += 2)
	{
		const glw::GLuint texture_coordinates_offset = i * n_texture_coordinates_components;
		const glw::GLuint grad_offset				 = i * n_grad_components;

		getRightNeighbour(texture_coordinates + texture_coordinates_offset, face, 4 * width, width,
						  grad_x + grad_offset);
	}

	for (glw::GLuint i = 0; i < n_points_per_face; ++i)
	{
		const glw::GLuint texture_coordinates_offset = i * n_texture_coordinates_components;
		const glw::GLuint grad_offset				 = i * n_grad_components;

		vectorSubtractInPlace<3>(grad_x + grad_offset, texture_coordinates + texture_coordinates_offset);
	}
}